

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

run_container_t * run_container_clone(run_container_t *src)

{
  int *in_RDI;
  run_container_t *run;
  undefined8 in_stack_ffffffffffffffe8;
  run_container_t *local_8;
  
  local_8 = run_container_create_given_capacity((int32_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20))
  ;
  if (local_8 == (run_container_t *)0x0) {
    local_8 = (run_container_t *)0x0;
  }
  else {
    local_8->capacity = in_RDI[1];
    local_8->n_runs = *in_RDI;
    memcpy(local_8->runs,*(void **)(in_RDI + 2),(long)*in_RDI << 2);
  }
  return local_8;
}

Assistant:

ALLOW_UNALIGNED
run_container_t *run_container_clone(const run_container_t *src) {
    run_container_t *run = run_container_create_given_capacity(src->capacity);
    if (run == NULL) return NULL;
    run->capacity = src->capacity;
    run->n_runs = src->n_runs;
    memcpy(run->runs, src->runs, src->n_runs * sizeof(rle16_t));
    return run;
}